

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::OP_WasmPrintFunc(InterpreterStackFrame *this,int regIndex)

{
  code *pcVar1;
  bool bVar2;
  uint index_00;
  int iVar3;
  undefined4 *puVar4;
  AsmJsFunctionInfo *this_00;
  WebAssemblyModule *this_01;
  WasmFunctionInfo *this_02;
  FunctionBody *this_03;
  int col;
  WasmFunctionInfo *info;
  uint index;
  int regIndex_local;
  InterpreterStackFrame *this_local;
  
  bVar2 = ParseableFunctionInfo::IsWasmFunction(*(ParseableFunctionInfo **)(this + 0x88));
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x2578,"(m_functionBody->IsWasmFunction())",
                                "m_functionBody->IsWasmFunction()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  index_00 = GetRegRawInt<int>(this,regIndex);
  this_00 = FunctionBody::GetAsmJsFunctionInfo(*(FunctionBody **)(this + 0x88));
  this_01 = AsmJsFunctionInfo::GetWebAssemblyModule(this_00);
  this_02 = WebAssemblyModule::GetWasmFunctionInfo(this_01,index_00);
  iVar3 = WAsmJs::Tracing::GetPrintCol();
  if (0 < iVar3) {
    Output::SkipToColumn((long)iVar3);
  }
  this_03 = Wasm::WasmFunctionInfo::GetBody(this_02);
  FunctionBody::DumpFullFunctionName(this_03);
  Output::Print(L"(");
  return;
}

Assistant:

void InterpreterStackFrame::OP_WasmPrintFunc(int regIndex)
    {
#if defined(ENABLE_DEBUG_CONFIG_OPTIONS) && defined(ENABLE_WASM)
        Assert(m_functionBody->IsWasmFunction());
        uint index = GetRegRawInt(regIndex);
        Wasm::WasmFunctionInfo* info = m_functionBody->GetAsmJsFunctionInfo()->GetWebAssemblyModule()->GetWasmFunctionInfo(index);
        int col = WAsmJs::Tracing::GetPrintCol();
        if (col > 0)
        {
            Output::SkipToColumn(col);
        }
        info->GetBody()->DumpFullFunctionName();
        Output::Print(_u("("));
#endif
    }